

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::SingleTex2DShader::shadeFragments
          (SingleTex2DShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  float fragNdx_00;
  float packetNdx_00;
  float s;
  float t;
  undefined1 local_54 [24];
  float lod;
  Vec4 v_coord;
  int fragNdx;
  int packetNdx;
  FragmentShadingContext *context_local;
  int numPackets_local;
  FragmentPacket *packets_local;
  SingleTex2DShader *this_local;
  
  for (v_coord.m_data[3] = 0.0; (int)v_coord.m_data[3] < numPackets;
      v_coord.m_data[3] = (float)((int)v_coord.m_data[3] + 1)) {
    for (v_coord.m_data[2] = 0.0; (int)v_coord.m_data[2] < 4;
        v_coord.m_data[2] = (float)((int)v_coord.m_data[2] + 1)) {
      rr::readVarying<float>
                ((rr *)(local_54 + 0x14),packets + (int)v_coord.m_data[3],context,0,
                 (int)v_coord.m_data[2]);
      packetNdx_00 = v_coord.m_data[3];
      fragNdx_00 = v_coord.m_data[2];
      local_54._16_4_ = TYPE_1D;
      std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                (&(this->super_ShaderProgram).m_uniforms,0);
      s = tcu::Vector<float,_4>::x((Vector<float,_4> *)(local_54 + 0x14));
      t = tcu::Vector<float,_4>::y((Vector<float,_4> *)(local_54 + 0x14));
      sglr::rc::Texture2D::sample((Texture2D *)local_54,s,t,0.0);
      rr::writeFragmentOutput<tcu::Vector<float,4>>
                (context,(int)packetNdx_00,(int)fragNdx_00,0,(Vector<float,_4> *)local_54);
    }
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4 v_coord = rr::readVarying<float>(packets[packetNdx], context, 0, fragNdx);
			const float		lod		= 0.0f;

			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, this->m_uniforms[0].sampler.tex2D->sample(v_coord.x(), v_coord.y(), lod));
		}
	}